

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::HaveInstallTreeRPATH(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  byte local_99;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *install_rpath;
  cmTarget *this_local;
  
  install_rpath = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"INSTALL_RPATH",&local_41);
  pcVar4 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar2 = false;
  bVar1 = false;
  local_99 = 0;
  local_20 = pcVar4;
  if ((pcVar4 != (char *)0x0) && (local_99 = 0, *pcVar4 != '\0')) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string((string *)&local_78,"CMAKE_SKIP_INSTALL_RPATH",&local_79);
    bVar1 = true;
    bVar3 = cmMakefile::IsOn(this_00,&local_78);
    local_99 = bVar3 ^ 0xff;
  }
  this_local._7_1_ = local_99 & 1;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTarget::HaveInstallTreeRPATH() const
{
  const char* install_rpath = this->GetProperty("INSTALL_RPATH");
  return (install_rpath && *install_rpath) &&
          !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
}